

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::ArchiveShellCommand::configureOutputs
          (ArchiveShellCommand *this,ConfigureContext *ctx,
          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value
          )

{
  bool bVar1;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *this_00;
  ulong uVar2;
  Twine local_b0;
  StringRef local_98;
  Twine local_88;
  StringRef local_70;
  string local_60;
  reference local_40;
  BuildNode **output;
  const_iterator __end2;
  const_iterator __begin2;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *__range2;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value_local;
  ConfigureContext *ctx_local;
  ArchiveShellCommand *this_local;
  
  llbuild::buildsystem::ExternalCommand::configureOutputs(&this->super_ExternalCommand,ctx,value);
  this_00 = llbuild::buildsystem::Command::getOutputs((Command *)this);
  __end2 = std::
           vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
           ::begin(this_00);
  output = (BuildNode **)
           std::
           vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
           ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                                     *)&output), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
               ::operator*(&__end2);
    bVar1 = llbuild::buildsystem::BuildNode::isVirtual(*local_40);
    if (!bVar1) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        local_98 = llbuild::buildsystem::Node::getName(&(*local_40)->super_Node);
        llvm::operator+(&local_88,"unexpected explicit output: ",&local_98);
        llbuild::buildsystem::ConfigureContext::error(ctx,&local_88);
      }
      else {
        local_70 = llbuild::buildsystem::Node::getName(&(*local_40)->super_Node);
        llvm::StringRef::operator_cast_to_string(&local_60,&local_70);
        std::__cxx11::string::operator=((string *)&this->archiveName,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
    }
    __gnu_cxx::
    __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
    ::operator++(&__end2);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    llvm::Twine::Twine(&local_b0,"missing expected output");
    llbuild::buildsystem::ConfigureContext::error(ctx,&local_b0);
  }
  return;
}

Assistant:

virtual void configureOutputs(const ConfigureContext& ctx,
                                const std::vector<Node*>& value) override {
    ExternalCommand::configureOutputs(ctx, value);

    for (const auto& output: getOutputs()) {
      if (!output->isVirtual()) {
        if (archiveName.empty()) {
          archiveName = output->getName();
        } else {
          ctx.error("unexpected explicit output: " + output->getName());
        }
      }
    }
    if (archiveName.empty()) {
      ctx.error("missing expected output");
    }
  }